

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

char * google::protobuf::FastHexToBuffer(int i,char *buffer)

{
  LogMessage *pLVar1;
  char *pcVar2;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (i < 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/strutil.cc"
               ,0x37d);
    pLVar1 = internal::LogMessage::operator<<(&local_60,"CHECK failed: i >= 0: ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"FastHexToBuffer() wants non-negative integers, not ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,i);
    internal::LogFinisher::operator=(&local_21,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
  }
  buffer[0x15] = '\0';
  pcVar2 = buffer + 0x15;
  do {
    pcVar2[-1] = "0123456789abcdef"[i & 0xf];
    pcVar2 = pcVar2 + -1;
    i = i >> 4;
  } while (0 < i);
  return pcVar2;
}

Assistant:

char *FastHexToBuffer(int i, char* buffer) {
  GOOGLE_CHECK(i >= 0) << "FastHexToBuffer() wants non-negative integers, not " << i;

  static const char *hexdigits = "0123456789abcdef";
  char *p = buffer + 21;
  *p-- = '\0';
  do {
    *p-- = hexdigits[i & 15];   // mod by 16
    i >>= 4;                    // divide by 16
  } while (i > 0);
  return p + 1;
}